

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O1

void __thiscall Pl_StdioFile::Pl_StdioFile(Pl_StdioFile *this,char *identifier,FILE *f)

{
  Members *pMVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,(Pipeline *)0x0);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_StdioFile_002f2818;
  pMVar1 = (Members *)operator_new(8);
  pMVar1->file = f;
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>.
  super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

Pl_StdioFile::Pl_StdioFile(char const* identifier, FILE* f) :
    Pipeline(identifier, nullptr),
    m(std::make_unique<Members>(f))
{
}